

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O0

imgviz * __thiscall
imgviz::textInRectangle
          (imgviz *this,Mat *src,string *text,string *loc,int font_face,double font_scale,
          int thickness)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  Scalar_<double> local_368;
  Point_<int> local_348;
  _InputOutputArray local_340;
  Scalar_<double> local_328;
  Point_<int> local_308;
  Point_<int> local_300;
  _InputOutputArray local_2f8;
  _OutputArray local_2e0;
  _InputArray local_2c8;
  _InputArray local_2b0;
  double local_298;
  _InputArray local_290;
  MatExpr local_278 [352];
  undefined1 local_118 [8];
  Mat extender;
  Point_<int> local_b4;
  Point_<int> local_ac;
  Point aabb2;
  Point_<int> local_9c;
  Point aabb1;
  Point text_org;
  Size text_size;
  int baseline;
  _InputArray local_68;
  byte local_3d;
  uint local_3c;
  double dStack_38;
  int thickness_local;
  double font_scale_local;
  string *psStack_28;
  int font_face_local;
  string *loc_local;
  string *text_local;
  Mat *src_local;
  Mat *dst;
  
  local_3c = thickness;
  dStack_38 = font_scale;
  font_scale_local._4_4_ = font_face;
  psStack_28 = loc;
  loc_local = text;
  text_local = (string *)src;
  src_local = (Mat *)this;
  bVar2 = std::operator==(loc,"lt+");
  if (!bVar2) {
    __assert_fail("loc == \"lt+\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,200,
                  "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
                 );
  }
  local_3d = 0;
  cv::Mat::clone();
  iVar3 = cv::Mat::type((Mat *)this);
  if (iVar3 == 0) {
    cv::_InputArray::_InputArray(&local_68,(Mat *)this);
    cv::_OutputArray::_OutputArray((_OutputArray *)&text_size.height,(Mat *)this);
    cv::cvtColor((cv *)&local_68,(_InputArray *)&text_size.height,(_OutputArray *)0x8,0,font_face);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&text_size.height);
    cv::_InputArray::~_InputArray(&local_68);
  }
  iVar3 = cv::Mat::type((Mat *)this);
  if (iVar3 == 0x10) {
    cv::getTextSize((string *)&text_org,(int)text,dStack_38,font_scale_local._4_4_,
                    (int *)(ulong)local_3c);
    text_size.width = text_size.width + local_3c;
    cv::Point_<int>::Point_(&aabb1,0,text_org.y + local_3c * 2);
    cv::Point_<int>::Point_(&aabb2,0,text_size.width + local_3c * -2);
    cv::operator+((cv *)&local_9c,&aabb1,&aabb2);
    cv::Point_<int>::Point_(&local_b4,text_org.x,-(text_org.y + local_3c * 2));
    cv::operator+((cv *)&local_ac,&aabb1,&local_b4);
    cv::Mat::zeros((int)local_278,local_9c.y - local_ac.y,*(int *)(src + 0xc));
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)local_118);
    cv::MatExpr::~MatExpr(local_278);
    local_298 = 255.0;
    cv::_InputArray::_InputArray(&local_290,&local_298);
    cv::noArray();
    cv::Mat::setTo((_InputArray *)local_118,&local_290);
    cv::_InputArray::~_InputArray(&local_290);
    cv::_InputArray::_InputArray(&local_2b0,(Mat *)local_118);
    cv::_InputArray::_InputArray(&local_2c8,(Mat *)this);
    cv::_OutputArray::_OutputArray(&local_2e0,(Mat *)this);
    cv::vconcat(&local_2b0,&local_2c8,&local_2e0);
    cv::_OutputArray::~_OutputArray(&local_2e0);
    cv::_InputArray::~_InputArray(&local_2c8);
    cv::_InputArray::~_InputArray(&local_2b0);
    cv::_InputOutputArray::_InputOutputArray(&local_2f8,(Mat *)this);
    cv::Point_<int>::Point_(&local_300,&local_9c);
    cv::Point_<int>::Point_(&local_308,&local_ac);
    cv::Scalar_<double>::Scalar_(&local_328,255.0,255.0,255.0,0.0);
    cv::rectangle(&local_2f8,&local_300,&local_308,&local_328,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_2f8);
    cv::_InputOutputArray::_InputOutputArray(&local_340,(Mat *)this);
    cv::Point_<int>::Point_(&local_348,&aabb1);
    iVar3 = font_scale_local._4_4_;
    dVar1 = dStack_38;
    cv::Scalar_<double>::Scalar_(&local_368,0.0,0.0,0.0,0.0);
    cv::putText(dVar1,&local_340,text,&local_348,iVar3,&local_368,local_3c,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_340);
    local_3d = 1;
    cv::Mat::~Mat((Mat *)local_118);
    if ((local_3d & 1) == 0) {
      cv::Mat::~Mat((Mat *)this);
    }
    return this;
  }
  __assert_fail("dst.type() == CV_8UC3",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                ,0xce,
                "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
               );
}

Assistant:

cv::Mat textInRectangle(const cv::Mat src, const std::string text,
                        const std::string loc = "lt+",
                        const int font_face = cv::FONT_HERSHEY_SIMPLEX,
                        const double font_scale = 1, const int thickness = 2) {
  assert(loc == "lt+"); // TODO(wkentaro): support other loc

  cv::Mat dst = src.clone();
  if (dst.type() == CV_8UC1) {
    cv::cvtColor(dst, dst, cv::COLOR_GRAY2BGR);
  }
  assert(dst.type() == CV_8UC3);

  int baseline;
  cv::Size text_size =
      cv::getTextSize(text, font_face, font_scale, thickness, &baseline);
  baseline += thickness;

  cv::Point text_org = cv::Point(0, text_size.height + thickness * 2);

  cv::Point aabb1 = text_org + cv::Point(0, baseline - thickness * 2);
  cv::Point aabb2 =
      text_org + cv::Point(text_size.width, -text_size.height - thickness * 2);

  cv::Mat extender = cv::Mat::zeros(aabb1.y - aabb2.y, src.cols, CV_8UC3);
  extender.setTo(255);
  cv::vconcat(extender, dst, dst);

  cv::rectangle(dst, aabb1, aabb2,
                /*color=*/cv::Scalar(255, 255, 255),
                /*thickness=*/cv::FILLED);
  cv::putText(dst, text, /*org=*/text_org,
              /*fontFace=*/font_face,
              /*fontScale=*/font_scale, /*color=*/cv::Scalar(0, 0, 0),
              /*thickness=*/thickness);

  return dst;
}